

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_write_add_filter_zstd.c
# Opt level: O3

int string_to_size(char *string,size_t *numberp)

{
  byte *in_RAX;
  uintmax_t uVar1;
  int *piVar2;
  byte bVar3;
  ulong uVar4;
  int iVar5;
  sbyte sVar6;
  char *end;
  byte *local_38;
  
  iVar5 = -0x14;
  if (string == (char *)0x0) {
    return -0x14;
  }
  if (*string == '\0') {
    return -0x14;
  }
  if (*string == '-') {
    return -0x14;
  }
  local_38 = in_RAX;
  uVar1 = strtoumax(string,(char **)&local_38,10);
  sVar6 = 0;
  if (local_38 <= string) goto LAB_001492c6;
  bVar3 = *local_38;
  uVar4 = (ulong)(bVar3 - 0x47);
  sVar6 = 0;
  if (bVar3 - 0x47 < 0x27) {
    if ((0x100000001U >> (uVar4 & 0x3f) & 1) == 0) {
      if ((0x1000000010U >> (uVar4 & 0x3f) & 1) == 0) {
        sVar6 = 0;
        if ((0x4000000040U >> (uVar4 & 0x3f) & 1) == 0) goto LAB_001492b4;
        sVar6 = 0x14;
      }
      else {
        sVar6 = 10;
      }
    }
    else {
      sVar6 = 0x1e;
    }
    local_38 = local_38 + 1;
    bVar3 = *local_38;
  }
LAB_001492b4:
  if ((bVar3 | 0x20) == 0x62) {
    local_38 = local_38 + 1;
  }
LAB_001492c6:
  if ((((local_38 != (byte *)string) && (*local_38 == 0)) &&
      (piVar2 = __errno_location(), *piVar2 != 0x4b)) && (uVar1 <= 0xffffffffffffffffU >> sVar6)) {
    *numberp = uVar1 << sVar6;
    iVar5 = 0;
  }
  return iVar5;
}

Assistant:

static int
string_to_size(const char *string, size_t *numberp)
{
	uintmax_t number;
	char *end;
	unsigned int shift = 0;

	if (string == NULL || *string == '\0' || *string == '-')
		return (ARCHIVE_WARN);
	number = strtoumax(string, &end, 10);
	if (end > string) {
		if (*end == 'K' || *end == 'k') {
			shift = 10;
			end++;
		} else if (*end == 'M' || *end == 'm') {
			shift = 20;
			end++;
		} else if (*end == 'G' || *end == 'g') {
			shift = 30;
			end++;
		}
		if (*end == 'B' || *end == 'b') {
			end++;
		}
	}
	if (end == string || *end != '\0' || errno == EOVERFLOW) {
		return (ARCHIVE_WARN);
	}
	if (number > (uintmax_t)SIZE_MAX >> shift) {
		return (ARCHIVE_WARN);
	}
	*numberp = (size_t)(number << shift);
	return (ARCHIVE_OK);
}